

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.h
# Opt level: O2

bool __thiscall Js::BufferReader::Read<Js::ThisInfo>(BufferReader *this,ThisInfo *data)

{
  ulong uVar1;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  
  uVar1 = this->lengthLeft;
  if (uVar1 < 4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/DynamicProfileInfo.h"
                                ,0x3bc,"(false)","false");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  else {
    paVar2 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)this->current;
    data->thisType = *(Type *)(paVar2 + 1);
    (data->valueType).field_0 = *paVar2;
    this->current = this->current + 4;
    this->lengthLeft = this->lengthLeft - 4;
  }
  return 3 < uVar1;
}

Assistant:

bool Read(T * data)
        {
            if (lengthLeft < sizeof(T))
            {
                AssertOrFailFast(false);
                return false;
            }
            *data = *(T *)current;
            current += sizeof(T);
            lengthLeft -= sizeof(T);
            return true;
        }